

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O0

bool template_image::NullAssignment(void)

{
  ImageTemplate<unsigned_char> *unaff_retaddr;
  imageException *anon_var_0;
  uint8_t fakeValue;
  uint8_t fakeArray [1];
  ImageTemplate<unsigned_char> image;
  uint8_t in_stack_ffffffffffffffb6;
  uint8_t in_stack_ffffffffffffffb7;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined2 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc2;
  undefined5 in_stack_ffffffffffffffc3;
  uint8_t in_stack_ffffffffffffffee;
  uint8_t in_stack_ffffffffffffffef;
  uint32_t in_stack_fffffffffffffff0;
  uint32_t in_stack_fffffffffffffff4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT53(in_stack_ffffffffffffffc3,
                      CONCAT12(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0)),
             in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7,
             in_stack_ffffffffffffffb6);
  Test_Helper::randomValue<unsigned_char>(0x18c397);
  PenguinV_Image::ImageTemplate<unsigned_char>::assign
            (unaff_retaddr,(uchar *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
             in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffef,
             in_stack_ffffffffffffffee);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x18c430);
  return false;
}

Assistant:

bool NullAssignment()
    {
        try {
            PenguinV_Image::ImageTemplate < uint8_t > image;

            uint8_t fakeArray[1];
            uint8_t fakeValue = Unit_Test::randomValue<uint8_t>( 2 );
            if( fakeValue == 1 )
                fakeValue = 0;

            image.assign( fakeArray, fakeValue, fakeValue, fakeValue, fakeValue );
        }
        catch( imageException & ) {
            return true;
        }

        return false;
    }